

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall
binlog::PrettyPrinter::printEventField
          (PrettyPrinter *this,OstreamBuffer *out,char spec,Event *event,WriterProp *writerProp)

{
  char cVar1;
  size_type sVar2;
  cx_string<4UL> cVar3;
  undefined8 in_RAX;
  Event *pEVar4;
  undefined7 in_register_00000011;
  void *__buf;
  int iVar5;
  pointer pcVar6;
  uint64_t v;
  undefined8 local_18;
  
  local_18._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  iVar5 = (int)CONCAT71(in_register_00000011,spec);
  switch(iVar5) {
  case 0x43:
    iVar5 = (int)(event->source->category)._M_dataplus._M_p;
    __buf = (void *)(event->source->category)._M_string_length;
    break;
  case 0x44:
  case 0x45:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x52:
    goto switchD_0010ba11_caseD_44;
  case 0x46:
    iVar5 = (int)(event->source->file)._M_dataplus._M_p;
    __buf = (void *)(event->source->file)._M_string_length;
    break;
  case 0x47:
    sVar2 = (event->source->file)._M_string_length;
    pcVar6 = (event->source->file)._M_dataplus._M_p + sVar2;
    event = (Event *)0x0;
    do {
      pEVar4 = event;
      event = pEVar4;
      if ((-(long)pEVar4 == sVar2) || (cVar1 = (pcVar6 + -1)[(long)pEVar4], cVar1 == '\\')) break;
      event = (Event *)((long)&pEVar4[-1].arguments._end + 7);
    } while (cVar1 != '/');
    iVar5 = (int)pcVar6 + (int)pEVar4;
    __buf = (void *)-(long)pEVar4;
    break;
  case 0x49:
    v = event->source->id;
    goto LAB_0010bb5c;
  case 0x4c:
    v = event->source->line;
LAB_0010bb5c:
    detail::OstreamBuffer::writeUnsigned(out,v);
    return;
  case 0x4d:
    iVar5 = (int)(event->source->function)._M_dataplus._M_p;
    __buf = (void *)(event->source->function)._M_string_length;
    break;
  case 0x50:
    iVar5 = (int)(event->source->formatString)._M_dataplus._M_p;
    __buf = (void *)(event->source->formatString)._M_string_length;
    break;
  case 0x53:
    cVar3 = severityToString(event->source->severity);
    local_18 = CONCAT35(local_18._5_3_,cVar3._data);
    detail::OstreamBuffer::write(out,(int)&local_18,(void *)0x4,(size_t)event);
    return;
  case 0x54:
    iVar5 = (int)(event->source->argumentTags)._M_dataplus._M_p;
    __buf = (void *)(event->source->argumentTags)._M_string_length;
    break;
  default:
    switch(iVar5) {
    case 0x6d:
      printEventMessage(this,out,event);
      return;
    case 0x6e:
      iVar5 = (int)(writerProp->name)._M_dataplus._M_p;
      __buf = (void *)(writerProp->name)._M_string_length;
      goto LAB_0010bb73;
    case 0x72:
      v = event->clockValue;
      break;
    case 0x74:
      v = writerProp->id;
      break;
    case 0x75:
      printUTCTime(this,out,event->clockValue);
      return;
    default:
      if (iVar5 == 0x25) {
        spec = '%';
        goto LAB_0010bb85;
      }
      if (iVar5 == 100) {
        printProducerLocalTime(this,out,event->clockValue);
        return;
      }
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
switchD_0010ba11_caseD_44:
      detail::OstreamBuffer::put(out,'%');
LAB_0010bb85:
      detail::OstreamBuffer::put(out,spec);
      return;
    }
    goto LAB_0010bb5c;
  }
LAB_0010bb73:
  detail::OstreamBuffer::write(out,iVar5,__buf,(size_t)event);
  return;
}

Assistant:

void PrettyPrinter::printEventField(
  detail::OstreamBuffer& out,
  char spec,
  const Event& event,
  const WriterProp& writerProp
) const
{
  switch (spec)
  {
  case 'I':
    out << event.source->id;
    break;
  case 'S':
    out << severityToString(event.source->severity);
    break;
  case 'C':
    out << event.source->category;
    break;
  case 'M':
    out << event.source->function;
    break;
  case 'F':
    out << event.source->file;
    break;
  case 'G':
    printFilename(out, event.source->file);
    break;
  case 'L':
    out << event.source->line;
    break;
  case 'P':
    out << event.source->formatString;
    break;
  case 'T':
    out << event.source->argumentTags;
    break;
  case 'n':
    out << writerProp.name;
    break;
  case 't':
    out << writerProp.id;
    break;
  case 'd':
    printProducerLocalTime(out, event.clockValue);
    break;
  case 'u':
    printUTCTime(out, event.clockValue);
    break;
  case 'r':
    out << event.clockValue;
    break;
  case 'm':
    printEventMessage(out, event);
    break;
  case '%':
    out.put('%');
    break;
  default:
    out << '%' << spec;
    break;
  }
}